

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall QO_Manager::Compute(QO_Manager *this,QO_Rel *relOrder,float *costEst,float *tupleEst)

{
  int iVar1;
  RC RVar2;
  bool bVar3;
  int iVar4;
  reference piVar5;
  reference pvVar6;
  mapped_type *ppcVar7;
  int nextSubJoin;
  int index;
  int i_3;
  int i_2;
  int relsInJoin;
  _Self local_d0;
  byte local_c1;
  iterator iStack_c0;
  bool isInOptCost2;
  _Self local_b8;
  byte local_ad;
  int local_ac;
  int iStack_a8;
  bool isInOptCost1;
  int newRelsInJoin;
  int relsInJoin_1;
  int j;
  int *local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  iterator it;
  vector<int,_std::allocator<int>_> allNewSubsets;
  int i_1;
  int local_58;
  int local_54;
  int bitmap;
  int i;
  vector<int,_std::allocator<int>_> allSubsets;
  RC rc;
  float *tupleEst_local;
  float *costEst_local;
  QO_Rel *relOrder_local;
  QO_Manager *this_local;
  
  allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = InitializeBaseCases(this);
  RVar2 = allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  if (allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&bitmap);
    for (local_54 = 0; local_54 < this->nRels; local_54 = local_54 + 1) {
      local_58 = 0;
      allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = AddRelToBitmap(this,local_54,&local_58);
      RVar2 = allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      if (allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != 0) goto LAB_0012506d;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&bitmap,&local_58);
    }
    for (allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ = 1;
        allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < this->nRels;
        allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             allNewSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&it);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator(&local_90);
      local_98 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)&bitmap);
      local_90._M_current = local_98;
      while( true ) {
        _relsInJoin_1 =
             std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&bitmap);
        bVar3 = __gnu_cxx::operator!=
                          (&local_90,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &relsInJoin_1);
        if (!bVar3) break;
        for (newRelsInJoin = 0; newRelsInJoin < this->nRels; newRelsInJoin = newRelsInJoin + 1) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_90);
          local_ac = *piVar5;
          iStack_a8 = local_ac;
          AddRelToBitmap(this,newRelsInJoin,&local_ac);
          pvVar6 = std::
                   vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                   ::operator[](&this->optcost,
                                (long)(allNewSubsets.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1)
                               );
          local_b8._M_node =
               (_Base_ptr)
               std::
               map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
               ::find(pvVar6,&local_ac);
          pvVar6 = std::
                   vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                   ::operator[](&this->optcost,
                                (long)(allNewSubsets.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1)
                               );
          iStack_c0 = std::
                      map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                      ::end(pvVar6);
          local_ad = std::operator!=(&local_b8,&stack0xffffffffffffff40);
          pvVar6 = std::
                   vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                   ::operator[](&this->optcost,
                                (long)allNewSubsets.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_d0._M_node =
               (_Base_ptr)
               std::
               map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
               ::find(pvVar6,&local_ac);
          pvVar6 = std::
                   vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                   ::operator[](&this->optcost,
                                (long)allNewSubsets.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          _i_2 = std::
                 map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                 ::end(pvVar6);
          local_c1 = std::operator!=(&local_d0,(_Self *)&i_2);
          bVar3 = IsBitSet(this,newRelsInJoin,iStack_a8);
          if (((!bVar3) && ((local_ad & 1) == 0)) && ((local_c1 & 1) == 0)) {
            allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ =
                 CalculateOptJoin(this,local_ac,
                                  allNewSubsets.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            if (allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
              bVar3 = true;
              this_local._4_4_ =
                   allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
              goto LAB_00124da9;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&it,&local_ac);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_90);
      }
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&bitmap);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&bitmap,
                 (vector<int,_std::allocator<int>_> *)&it);
      bVar3 = false;
LAB_00124da9:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
      RVar2 = this_local._4_4_;
      if (bVar3) goto LAB_0012506d;
    }
    i_3 = 0;
    for (index = 0; index < this->nRels; index = index + 1) {
      allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = AddRelToBitmap(this,index,&i_3);
      RVar2 = allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      if (allSubsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != 0) goto LAB_0012506d;
    }
    pvVar6 = std::
             vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             ::operator[](&this->optcost,(long)(this->nRels + -1));
    ppcVar7 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[](pvVar6,&i_3);
    *costEst = (*ppcVar7)->cost;
    pvVar6 = std::
             vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             ::operator[](&this->optcost,(long)(this->nRels + -1));
    ppcVar7 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[](pvVar6,&i_3);
    *tupleEst = (*ppcVar7)->numTuples;
    for (nextSubJoin = 0; nextSubJoin < this->nRels; nextSubJoin = nextSubJoin + 1) {
      iVar4 = ~nextSubJoin + this->nRels;
      pvVar6 = std::
               vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               ::operator[](&this->optcost,(long)iVar4);
      ppcVar7 = std::
                map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::operator[](pvVar6,&i_3);
      iVar1 = (*ppcVar7)->joins;
      pvVar6 = std::
               vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               ::operator[](&this->optcost,(long)iVar4);
      ppcVar7 = std::
                map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::operator[](pvVar6,&i_3);
      relOrder[iVar4].relIdx = (*ppcVar7)->newRelIndex;
      pvVar6 = std::
               vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               ::operator[](&this->optcost,(long)iVar4);
      ppcVar7 = std::
                map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::operator[](pvVar6,&i_3);
      relOrder[iVar4].indexAttr = (*ppcVar7)->indexAttr;
      pvVar6 = std::
               vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               ::operator[](&this->optcost,(long)iVar4);
      ppcVar7 = std::
                map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                ::operator[](pvVar6,&i_3);
      relOrder[iVar4].indexCond = (*ppcVar7)->indexCond;
      i_3 = iVar1;
    }
    this_local._4_4_ = 0;
    RVar2 = this_local._4_4_;
LAB_0012506d:
    this_local._4_4_ = RVar2;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&bitmap);
    RVar2 = this_local._4_4_;
  }
  this_local._4_4_ = RVar2;
  return this_local._4_4_;
}

Assistant:

RC QO_Manager::Compute(QO_Rel *relOrder, float &costEst, float &tupleEst){
  RC rc = 0;
  // initialize the base relations
  if((rc = InitializeBaseCases()))
    return (rc);

  // create a vector containing bitmaps that
  // reflect all subsets of size 1
  vector<int> allSubsets;
  for(int i=0; i < nRels; i++){
    int bitmap = 0;
    if((rc = AddRelToBitmap(i, bitmap)))
      return (rc);
    allSubsets.push_back(bitmap);
  }

  for(int i=1; i < nRels; i++){ // for all sizes of subsets
    vector<int> allNewSubsets; // will hold all subsets of size i+1
                               // at the end of the iteration
    // iterate through all sets of the previous size
    vector<int>::iterator it;
    for(it= allSubsets.begin(); it != allSubsets.end(); ++it){
      for(int j=0; j < nRels; j++){ // go through all ways of adding a new relation
        int relsInJoin = *it;
        int newRelsInJoin = relsInJoin;
        AddRelToBitmap(j, newRelsInJoin);
        bool isInOptCost1 = (optcost[i-1].find(newRelsInJoin) != optcost[i-1].end());
        bool isInOptCost2 = (optcost[i].find(newRelsInJoin) != optcost[i].end());
        // If adding this new relation modifies the set (i.e. relation is not)
        // included in the set of the previous size) and we haven't calculated
        // the optimal way of joining this yet, do so
        if(!IsBitSet(j, relsInJoin) && !isInOptCost1 && !isInOptCost2){
          if((rc = CalculateOptJoin(newRelsInJoin, i))){
            return (rc);
          }
          // add this to the set.
          allNewSubsets.push_back(newRelsInJoin);
        }
      }
    }
    allSubsets.clear();
    allSubsets = allNewSubsets;
    // set the previous set of joins of size i to the set of joins
    // of size i+1
  }

  // create the bitmap containing all relations
  int relsInJoin = 0;
  for(int i = 0; i < nRels; i++){
    if((rc = AddRelToBitmap(i, relsInJoin)))
      return (rc);
  }
  // update the overall estimated costs and tuple numbers
  costEst = optcost[nRels-1][relsInJoin]->cost;
  tupleEst = optcost[nRels-1][relsInJoin]->numTuples;
  // backtrace: start with the set of all relations, and use the
  // "joins" field to get the cost stats of the previous opt join, and
  // move them to the appropriate location in QO_Rel array
  for(int i=0; i < nRels; i++){
    int index = nRels-i-1;
    int nextSubJoin = optcost[index][relsInJoin]->joins;
    relOrder[index].relIdx = optcost[index][relsInJoin]->newRelIndex;
    relOrder[index].indexAttr = optcost[index][relsInJoin]->indexAttr;
    relOrder[index].indexCond = optcost[index][relsInJoin]->indexCond;
    relsInJoin = nextSubJoin;
  }

  return (0);
}